

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<capnp::Orphan<capnp::compiler::Token>_> *
kj::_::
CopyConstructArray_<kj::Array<capnp::Orphan<capnp::compiler::Token>_>,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_*,_true,_false>
::apply(Array<capnp::Orphan<capnp::compiler::Token>_> *pos,
       Array<capnp::Orphan<capnp::compiler::Token>_> *start,
       Array<capnp::Orphan<capnp::compiler::Token>_> *end)

{
  for (; start != end; start = start + 1) {
    pos->ptr = start->ptr;
    pos->size_ = start->size_;
    pos->disposer = start->disposer;
    pos = pos + 1;
    start->ptr = (Orphan<capnp::compiler::Token> *)0x0;
    start->size_ = 0;
  }
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }